

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

void __thiscall
asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
set_option<asio::detail::socket_option::boolean<6,1>>
          (basic_socket<asio::ip::tcp,_asio::any_io_executor> *this,boolean<6,_1> *option)

{
  implementation_type *in_RSI;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RDI;
  error_code ec;
  char *in_stack_ffffffffffffffb8;
  error_code *in_stack_ffffffffffffffe0;
  boolean<6,_1> *in_stack_ffffffffffffffe8;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *this_00;
  
  this_00 = in_RDI;
  CLI::std::error_code::error_code((error_code *)in_RDI);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_service(in_RDI);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_implementation(in_RDI);
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  set_option<asio::detail::socket_option::boolean<6,1>>
            ((reactive_socket_service<asio::ip::tcp> *)this_00,in_RSI,in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
  asio::detail::throw_error((error_code *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void set_option(const SettableSocketOption& option)
  {
    asio::error_code ec;
    impl_.get_service().set_option(impl_.get_implementation(), option, ec);
    asio::detail::throw_error(ec, "set_option");
  }